

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O2

void dequeue_send_callback_data(SEND_CALLBACK_DATA *send_data)

{
  size_t *psVar1;
  IOTHUB_MESSAGING_HANDLE pIVar2;
  int iVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  pIVar2 = send_data->messagingHandle;
  iVar3 = singlylinkedlist_remove_if
                    (pIVar2->send_callback_data,remove_single_send_data_condition_function,send_data
                    );
  if (iVar3 == 0) {
    free(send_data);
    psVar1 = &pIVar2->send_queue_size;
    *psVar1 = *psVar1 - 1;
  }
  else {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                 ,"dequeue_send_callback_data",0xa5,1,
                 "Failed dequeueing send_data, not found in list.");
      return;
    }
  }
  return;
}

Assistant:

static void dequeue_send_callback_data(SEND_CALLBACK_DATA* send_data)
{
    IOTHUB_MESSAGING_HANDLE messagingHandle = send_data->messagingHandle;

    if (singlylinkedlist_remove_if(messagingHandle->send_callback_data, remove_single_send_data_condition_function, send_data) != 0)
    {
        LogError("Failed dequeueing send_data, not found in list.");
    }
    else
    {
        free(send_data);
        messagingHandle->send_queue_size--;
    }
}